

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

TRef recff_sbufx_checkint(jit_State *J,RecordFFData *rd,ptrdiff_t arg)

{
  TRef TVar1;
  TRef TVar2;
  uint local_74;
  TRef trlim;
  TRef tr;
  ptrdiff_t arg_local;
  RecordFFData *rd_local;
  jit_State *J_local;
  
  local_74 = J->base[arg];
  TVar1 = lj_ir_kint(J,0x7fffff00);
  if ((local_74 >> 0x18 & 0x1f) - 0xf < 5) {
    (J->fold).ins.field_0.ot = 0x693;
    (J->fold).ins.field_0.op1 = (IRRef1)local_74;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar1;
    lj_opt_fold(J);
  }
  else if ((local_74 & 0x1f000000) == 0xe000000) {
    (J->fold).ins.field_0.ot = 0x5b13;
    (J->fold).ins.field_0.op1 = (IRRef1)local_74;
    (J->fold).ins.field_0.op2 = 0x126e;
    local_74 = lj_opt_fold(J);
    (J->fold).ins.field_0.ot = 0x693;
    (J->fold).ins.field_0.op1 = (IRRef1)local_74;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar1;
    lj_opt_fold(J);
  }
  else {
    if ((local_74 & 0x1f000000) != 0xa000000) {
      lj_trace_err(J,LJ_TRERR_BADTYPE);
    }
    TVar1 = lj_crecord_loadiu64(J,local_74,rd->argv + arg);
    TVar2 = lj_ir_kint64(J,0x7fffff00);
    (J->fold).ins.field_0.ot = 0x696;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar2;
    lj_opt_fold(J);
    (J->fold).ins.field_0.ot = 0x5b13;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
    (J->fold).ins.field_0.op2 = 0x1275;
    local_74 = lj_opt_fold(J);
  }
  return local_74;
}

Assistant:

static TRef recff_sbufx_checkint(jit_State *J, RecordFFData *rd, ptrdiff_t arg)
{
  TRef tr = J->base[arg];
  TRef trlim = lj_ir_kint(J, LJ_MAX_BUF);
  if (tref_isinteger(tr)) {
    emitir(IRTGI(IR_ULE), tr, trlim);
  } else if (tref_isnum(tr)) {
    tr = emitir(IRTI(IR_CONV), tr, IRCONV_INT_NUM|IRCONV_ANY);
    emitir(IRTGI(IR_ULE), tr, trlim);
#if LJ_HASFFI
  } else if (tref_iscdata(tr)) {
    tr = lj_crecord_loadiu64(J, tr, &rd->argv[arg]);
    emitir(IRTG(IR_ULE, IRT_U64), tr, lj_ir_kint64(J, LJ_MAX_BUF));
    tr = emitir(IRTI(IR_CONV), tr, (IRT_INT<<5)|IRT_I64|IRCONV_NONE);
#else
    UNUSED(rd);
#endif
  } else {
    lj_trace_err(J, LJ_TRERR_BADTYPE);
  }
  return tr;
}